

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O0

void __thiscall piksel::Graphics::point(Graphics *this,float x,float y)

{
  State *pSVar1;
  State *state;
  float y_local;
  float x_local;
  Graphics *this_local;
  
  push(this);
  pSVar1 = peek(this);
  *(undefined8 *)&(pSVar1->shaderRelevantState).fillColor.field_0 =
       *(undefined8 *)&(pSVar1->shaderRelevantState).strokeColor.field_0;
  *(undefined8 *)((long)&(pSVar1->shaderRelevantState).fillColor.field_0 + 8) =
       *(undefined8 *)((long)&(pSVar1->shaderRelevantState).strokeColor.field_0 + 8);
  (pSVar1->shaderIrrelevantState).fill = (bool)((pSVar1->shaderIrrelevantState).stroke & 1);
  (pSVar1->shaderIrrelevantState).stroke = false;
  if (1.0 < (pSVar1->shaderRelevantState).strokeWeight) {
    ellipseMode(this,CENTER);
    ellipse(this,x,y,(pSVar1->shaderRelevantState).strokeWeight,
            (pSVar1->shaderRelevantState).strokeWeight);
  }
  else {
    rectMode(this,CENTER);
    rect(this,x,y,(pSVar1->shaderRelevantState).strokeWeight,
         (pSVar1->shaderRelevantState).strokeWeight);
  }
  pop(this);
  return;
}

Assistant:

void Graphics::point(float x, float y) {
	push();
	State& state = peek();
	state.shaderRelevantState.fillColor = state.shaderRelevantState.strokeColor;
    state.shaderIrrelevantState.fill = state.shaderIrrelevantState.stroke;
    state.shaderIrrelevantState.stroke = false;
    if (state.shaderRelevantState.strokeWeight <= 1.0f) {
        rectMode(DrawMode::CENTER);
        rect(x, y, state.shaderRelevantState.strokeWeight, state.shaderRelevantState.strokeWeight);
    } else {
        ellipseMode(DrawMode::CENTER);
        ellipse(x, y, state.shaderRelevantState.strokeWeight, state.shaderRelevantState.strokeWeight);
    }
	pop();
}